

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMapIterators.hpp
# Opt level: O2

mapped_type __thiscall BCL::BlindHashMapReference::operator_cast_to_int(BlindHashMapReference *this)

{
  undefined8 in_RAX;
  mapped_type value;
  mapped_type local_4;
  
  local_4 = (mapped_type)((ulong)in_RAX >> 0x20);
  if (*(int *)(this + 0x28) < 2) {
    HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
    ::find_nonatomic_impl_
              (*(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                 **)(this + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_4);
  }
  else {
    HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
    ::find_atomic_impl_(*(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                          **)(this + 0x20),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                        &local_4);
  }
  return local_4;
}

Assistant:

operator mapped_type() const {
    mapped_type value;
    bool success;
    if (atomicity_level_ <= HashMapAL::find) {
      success = hashmap_->find_nonatomic_impl_(key_, value);
    } else {
      success = hashmap_->find_atomic_impl_(key_, value);
    }
    return value;
  }